

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferCreateFd(void)

{
  int iVar1;
  xmlCharEncoding val;
  int iVar2;
  xmlParserInputBufferPtr val_00;
  int local_28;
  int n_enc;
  xmlCharEncoding enc;
  int n_fd;
  int fd;
  xmlParserInputBufferPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_enc = 0; n_enc < 4; n_enc = n_enc + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      iVar1 = xmlMemBlocks();
      enc = gen_int(n_enc,0);
      val = gen_xmlCharEncoding(local_28,1);
      if (XML_CHAR_ENCODING_ERROR < enc) {
        enc = XML_CHAR_ENCODING_ERROR;
      }
      val_00 = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFd(enc,val);
      desret_xmlParserInputBufferPtr(val_00);
      call_tests = call_tests + 1;
      des_int(n_enc,enc,0);
      des_xmlCharEncoding(local_28,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFd",
               (ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_enc);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlParserInputBufferCreateFd(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputBufferPtr ret_val;
    int fd; /* a file descriptor number */
    int n_fd;
    xmlCharEncoding enc; /* the charset encoding if known (deprecated) */
    int n_enc;

    for (n_fd = 0;n_fd < gen_nb_int;n_fd++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        fd = gen_int(n_fd, 0);
        enc = gen_xmlCharEncoding(n_enc, 1);
        if (fd >= 0) fd = -1;

        ret_val = xmlParserInputBufferCreateFd(fd, enc);
        desret_xmlParserInputBufferPtr(ret_val);
        call_tests++;
        des_int(n_fd, fd, 0);
        des_xmlCharEncoding(n_enc, enc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferCreateFd",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_fd);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}